

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O2

void __thiscall Assimp::Discreet3DSImporter::ConvertMeshes(Discreet3DSImporter *this,aiScene *pcOut)

{
  uint uVar1;
  pointer pMVar2;
  pointer pMVar3;
  pointer paVar4;
  undefined1 auVar5 [16];
  float fVar6;
  Scene *pSVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  aiMesh *paVar11;
  aiFace *paVar12;
  aiVector3D *paVar13;
  uint *puVar14;
  long lVar15;
  aiMesh **__s;
  DeadlyImportError *this_00;
  uint uVar16;
  aiFace *paVar17;
  Discreet3DSImporter *pDVar18;
  uint a;
  pointer pMVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  int local_49c;
  aiMesh *meshOut;
  uint local_490;
  uint iNum;
  ulong local_488;
  Discreet3DSImporter *local_480;
  unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[],_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
  aiSplit;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> avOutMeshes;
  aiString name;
  
  avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
            (&avOutMeshes,
             (((long)(this->mScene->mMeshes).
                     super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->mScene->mMeshes).
                    super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0xd8) * 2);
  name.length = 0;
  name.data[0] = '\0';
  memset(name.data + 1,0x1b,0x3ff);
  pSVar7 = this->mScene;
  pMVar19 = (pSVar7->mMeshes).
            super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_488 = 0;
  local_49c = 0;
  local_480 = this;
  for (; pMVar19 !=
         (pSVar7->mMeshes).
         super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
         super__Vector_impl_data._M_finish; pMVar19 = pMVar19 + 1) {
    pMVar2 = (pSVar7->mMaterials).
             super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pMVar3 = (pSVar7->mMaterials).
             super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar8 = ((long)pMVar3 - (long)pMVar2) / 0x2b8;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar8;
    uVar9 = SUB168(auVar5 * ZEXT816(0x18),0);
    uVar20 = uVar9 + 8;
    if (0xfffffffffffffff7 < uVar9) {
      uVar20 = 0xffffffffffffffff;
    }
    if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
      uVar20 = 0xffffffffffffffff;
    }
    puVar10 = (ulong *)operator_new__(uVar20);
    uVar20 = local_488;
    *puVar10 = uVar8;
    if (pMVar3 != pMVar2) {
      uVar8 = uVar8 * 0x18 - 0x18;
      memset(puVar10 + 1,0,(uVar8 - uVar8 % 0x18) + 0x18);
    }
    aiSplit._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>,_true,_true>
                    )(__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>,_true,_true>
                      )(puVar10 + 1);
    name.length = ASSIMP_itoa10<1024ul>(&name.data,(int)uVar20);
    iNum = 0;
    for (puVar14 = (pMVar19->mFaceMaterials).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        puVar14 !=
        (pMVar19->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish; puVar14 = puVar14 + 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((ulong)*puVar14 * 0x18 +
                 (long)aiSplit._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl),&iNum);
      iNum = iNum + 1;
    }
    uVar8 = 0;
    pDVar18 = local_480;
    local_488 = (ulong)((int)uVar20 + 1);
    while (uVar8 < (ulong)(((long)(pDVar18->mScene->mMaterials).
                                  super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pDVar18->mScene->mMaterials).
                                 super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x2b8)) {
      lVar22 = uVar8 * 0x18;
      uVar16 = (uint)uVar8;
      if (*(long *)((long)aiSplit._M_t.
                          super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                          .
                          super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                          ._M_head_impl + lVar22) !=
          *(long *)((long)aiSplit._M_t.
                          super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                          .
                          super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                          ._M_head_impl + 8 + lVar22)) {
        local_490 = (uint)uVar8;
        paVar11 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(paVar11);
        uVar20 = (ulong)name.length;
        (paVar11->mName).length = name.length;
        meshOut = paVar11;
        memcpy((paVar11->mName).data,name.data,uVar20);
        (paVar11->mName).data[uVar20] = '\0';
        paVar11->mPrimitiveTypes = 4;
        paVar11->mMaterialIndex = local_490;
        paVar11->mColors[0] = (aiColor4D *)pMVar19;
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&avOutMeshes,&meshOut);
        paVar11 = meshOut;
        uVar16 = (uint)((ulong)(*(long *)((long)aiSplit._M_t.
                                                super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                                                .
                                                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                                ._M_head_impl + 8 + lVar22) -
                               *(long *)((long)aiSplit._M_t.
                                               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                                               .
                                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                               ._M_head_impl + lVar22)) >> 2);
        meshOut->mNumFaces = uVar16;
        meshOut->mNumVertices = uVar16 * 3;
        uVar20 = (ulong)meshOut->mNumFaces;
        puVar10 = (ulong *)operator_new__(uVar20 * 0x10 + 8);
        *puVar10 = uVar20;
        paVar12 = (aiFace *)(puVar10 + 1);
        if (uVar20 != 0) {
          paVar17 = paVar12;
          do {
            paVar17->mNumIndices = 0;
            paVar17->mIndices = (uint *)0x0;
            paVar17 = paVar17 + 1;
          } while (paVar17 != paVar12 + uVar20);
        }
        paVar11->mFaces = paVar12;
        local_49c = local_49c + paVar11->mNumFaces;
        uVar16 = paVar11->mNumVertices;
        uVar20 = (ulong)uVar16 * 0xc;
        paVar13 = (aiVector3D *)operator_new__(uVar20);
        if (uVar16 != 0) {
          uVar20 = uVar20 - 0xc;
          memset(paVar13,0,(uVar20 - uVar20 % 0xc) + 0xc);
        }
        paVar11->mVertices = paVar13;
        uVar16 = paVar11->mNumVertices;
        uVar20 = (ulong)uVar16 * 0xc;
        paVar13 = (aiVector3D *)operator_new__(uVar20);
        if (uVar16 != 0) {
          uVar20 = uVar20 - 0xc;
          memset(paVar13,0,(uVar20 - uVar20 % 0xc) + 0xc);
        }
        paVar11->mNormals = paVar13;
        if ((pMVar19->mTexCoords).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (pMVar19->mTexCoords).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar16 = paVar11->mNumVertices;
          uVar20 = (ulong)uVar16 * 0xc;
          paVar13 = (aiVector3D *)operator_new__(uVar20);
          if (uVar16 != 0) {
            uVar20 = uVar20 - 0xc;
            memset(paVar13,0,(uVar20 - uVar20 % 0xc) + 0xc);
          }
          paVar11->mTextureCoords[0] = paVar13;
        }
        uVar21 = 0;
        uVar20 = 0;
        while( true ) {
          uVar8 = (ulong)uVar21;
          pDVar18 = local_480;
          uVar16 = local_490;
          if ((ulong)(*(long *)((long)aiSplit._M_t.
                                      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                                      .
                                      super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                      ._M_head_impl + 8 + lVar22) -
                      *(long *)((long)aiSplit._M_t.
                                      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                                      .
                                      super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                      ._M_head_impl + lVar22) >> 2) <= uVar8) break;
          uVar16 = *(uint *)(*(long *)((long)aiSplit._M_t.
                                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                                             .
                                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                             ._M_head_impl + lVar22) + uVar8 * 4);
          paVar12 = meshOut->mFaces;
          puVar14 = (uint *)operator_new__(0xc);
          paVar12[uVar8].mIndices = puVar14;
          paVar12[uVar8].mNumIndices = 3;
          for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
            uVar1 = (pMVar19->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
                    super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar16].super_FaceWithSmoothingGroup.
                    mIndices[lVar15];
            paVar4 = (pMVar19->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            paVar13 = meshOut->mVertices;
            uVar9 = uVar20 + lVar15 & 0xffffffff;
            paVar13[uVar9].z = *(float *)((long)(paVar4 + uVar1) + 8);
            paVar4 = paVar4 + uVar1;
            fVar6 = paVar4->y;
            paVar13 = paVar13 + uVar9;
            paVar13->x = paVar4->x;
            paVar13->y = fVar6;
            paVar4 = (pMVar19->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mNormals.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            paVar13 = meshOut->mNormals;
            paVar13[uVar9].z = paVar4[uVar1].z;
            paVar4 = paVar4 + uVar1;
            fVar6 = paVar4->y;
            paVar13 = paVar13 + uVar9;
            paVar13->x = paVar4->x;
            paVar13->y = fVar6;
            paVar4 = (pMVar19->mTexCoords).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((pMVar19->mTexCoords).
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_finish != paVar4) {
              paVar13 = meshOut->mTextureCoords[0];
              paVar13[uVar9].z = paVar4[uVar1].z;
              fVar6 = paVar4[uVar1].y;
              paVar13 = paVar13 + uVar9;
              paVar13->x = paVar4[uVar1].x;
              paVar13->y = fVar6;
            }
            paVar12[uVar8].mIndices[lVar15] = (uint)(uVar20 + lVar15);
          }
          uVar21 = uVar21 + 1;
          uVar20 = (ulong)((int)uVar20 + 3);
        }
      }
      uVar8 = (ulong)(uVar16 + 1);
    }
    std::
    unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[],_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
    ::~unique_ptr(&aiSplit);
    pSVar7 = pDVar18->mScene;
  }
  uVar20 = (long)avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start & 0x7fffffff8;
  uVar8 = (ulong)((long)avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  pcOut->mNumMeshes = (uint)uVar8;
  __s = (aiMesh **)operator_new__(uVar20);
  memset(__s,0,uVar20);
  pcOut->mMeshes = __s;
  for (uVar20 = 0; uVar20 < (uVar8 & 0xffffffff); uVar20 = uVar20 + 1) {
    pcOut->mMeshes[uVar20] =
         avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
         super__Vector_impl_data._M_start[uVar20];
    uVar8 = (ulong)pcOut->mNumMeshes;
  }
  if (local_49c == 0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&aiSplit,"No faces loaded. The mesh is empty",(allocator<char> *)&meshOut);
    DeadlyImportError::DeadlyImportError(this_00,(string *)&aiSplit);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
            (&avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
  return;
}

Assistant:

void Discreet3DSImporter::ConvertMeshes(aiScene* pcOut)
{
    std::vector<aiMesh*> avOutMeshes;
    avOutMeshes.reserve(mScene->mMeshes.size() * 2);

    unsigned int iFaceCnt = 0,num = 0;
    aiString name;

    // we need to split all meshes by their materials
    for (std::vector<D3DS::Mesh>::iterator i =  mScene->mMeshes.begin(); i != mScene->mMeshes.end();++i)    {
        std::unique_ptr< std::vector<unsigned int>[] > aiSplit(new std::vector<unsigned int>[mScene->mMaterials.size()]);

        name.length = ASSIMP_itoa10(name.data,num++);

        unsigned int iNum = 0;
        for (std::vector<unsigned int>::const_iterator a =  (*i).mFaceMaterials.begin();
            a != (*i).mFaceMaterials.end();++a,++iNum)
        {
            aiSplit[*a].push_back(iNum);
        }
        // now generate submeshes
        for (unsigned int p = 0; p < mScene->mMaterials.size();++p)
        {
            if (aiSplit[p].empty()) {
                continue;
            }
            aiMesh* meshOut = new aiMesh();
            meshOut->mName = name;
            meshOut->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

            // be sure to setup the correct material index
            meshOut->mMaterialIndex = p;

            // use the color data as temporary storage
            meshOut->mColors[0] = (aiColor4D*)(&*i);
            avOutMeshes.push_back(meshOut);

            // convert vertices
            meshOut->mNumFaces = (unsigned int)aiSplit[p].size();
            meshOut->mNumVertices = meshOut->mNumFaces*3;

            // allocate enough storage for faces
            meshOut->mFaces = new aiFace[meshOut->mNumFaces];
            iFaceCnt += meshOut->mNumFaces;

            meshOut->mVertices = new aiVector3D[meshOut->mNumVertices];
            meshOut->mNormals  = new aiVector3D[meshOut->mNumVertices];
            if ((*i).mTexCoords.size())
            {
                meshOut->mTextureCoords[0] = new aiVector3D[meshOut->mNumVertices];
            }
            for (unsigned int q = 0, base = 0; q < aiSplit[p].size();++q)
            {
                unsigned int index = aiSplit[p][q];
                aiFace& face = meshOut->mFaces[q];

                face.mIndices = new unsigned int[3];
                face.mNumIndices = 3;

                for (unsigned int a = 0; a < 3;++a,++base)
                {
                    unsigned int idx = (*i).mFaces[index].mIndices[a];
                    meshOut->mVertices[base]  = (*i).mPositions[idx];
                    meshOut->mNormals [base]  = (*i).mNormals[idx];

                    if ((*i).mTexCoords.size())
                        meshOut->mTextureCoords[0][base] = (*i).mTexCoords[idx];

                    face.mIndices[a] = base;
                }
            }
        }
    }

    // Copy them to the output array
    pcOut->mNumMeshes = (unsigned int)avOutMeshes.size();
    pcOut->mMeshes = new aiMesh*[pcOut->mNumMeshes]();
    for (unsigned int a = 0; a < pcOut->mNumMeshes;++a) {
        pcOut->mMeshes[a] = avOutMeshes[a];
    }

    // We should have at least one face here
    if (!iFaceCnt) {
        throw DeadlyImportError("No faces loaded. The mesh is empty");
    }
}